

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemb.c
# Opt level: O0

void encode_block(int plane,int block,int blk_row,int blk_col,BLOCK_SIZE plane_bsize,TX_SIZE tx_size
                 ,void *arg,RUN_TYPE dry_run)

{
  TX_TYPE TVar1;
  int blk_idx;
  int iVar2;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  undefined4 in_R8D;
  TX_SIZE in_R9B;
  long *in_stack_00000008;
  RUN_TYPE in_stack_00000010;
  TXB_CTX txb_ctx;
  _Bool do_dropout;
  _Bool do_trellis;
  int quant_idx;
  int use_trellis;
  QUANT_PARAM quant_param;
  TxfmParam txfm_param;
  int blk_skip_idx;
  TX_TYPE tx_type;
  int bw;
  int dummy_rate_cost;
  ENTROPY_CONTEXT *l;
  ENTROPY_CONTEXT *a;
  uint8_t *dst;
  tran_low_t *dqcoeff;
  macroblockd_plane *pd;
  macroblock_plane *p;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  MACROBLOCK *x;
  AV1_COMMON *cm;
  AV1_COMP *cpi;
  encode_b_args *args;
  QUANT_PARAM *in_stack_fffffffffffffef8;
  TXB_CTX *txb_ctx_00;
  ENTROPY_CONTEXT *in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  int in_stack_ffffffffffffff10;
  undefined2 uVar3;
  TX_SIZE tx_type_00;
  BLOCK_SIZE plane_bsize_00;
  undefined2 uVar4;
  TX_SIZE tx_size_00;
  undefined4 in_stack_ffffffffffffff23;
  undefined4 uVar5;
  PLANE_TYPE in_stack_ffffffffffffff27;
  undefined6 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2e;
  undefined1 in_stack_ffffffffffffff2f;
  uint in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  ENTROPY_CONTEXT local_c8 [8];
  int in_stack_ffffffffffffff40;
  TX_TYPE in_stack_ffffffffffffff46;
  TX_SIZE in_stack_ffffffffffffff47;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  uint in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  AV1_COMP *in_stack_ffffffffffffff58;
  TXB_CTX local_a0 [2];
  TXB_CTX *in_stack_ffffffffffffff70;
  uint3 in_stack_ffffffffffffff7c;
  uint uVar6;
  undefined4 uVar7;
  ENTROPY_CONTEXT local_7c [4];
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  MACROBLOCKD *local_40;
  long local_38;
  long local_30;
  long local_28;
  long *local_20;
  TX_SIZE local_12;
  byte local_11;
  int local_10;
  int local_c;
  int local_8;
  int local_4;
  
  uVar3 = (undefined2)in_R8D;
  tx_type_00 = (TX_SIZE)((uint)in_R8D >> 0x10);
  plane_bsize_00 = (BLOCK_SIZE)((uint)in_R8D >> 0x18);
  uVar4 = (undefined2)in_ESI;
  tx_size_00 = (TX_SIZE)((uint)in_ESI >> 0x10);
  uVar5 = CONCAT31((int3)((uint)in_stack_ffffffffffffff23 >> 8),(char)((uint)in_ESI >> 0x18));
  local_11 = (byte)in_R8D;
  local_20 = in_stack_00000008;
  local_28 = *in_stack_00000008;
  local_30 = local_28 + 0x3bf80;
  local_38 = in_stack_00000008[1];
  local_40 = (MACROBLOCKD *)(local_38 + 0x1a0);
  local_48 = **(long **)(local_38 + 0x2058);
  local_50 = local_38 + (long)in_EDI * 0x88;
  local_58 = local_38 + 0x1b0 + (long)in_EDI * 0xa30;
  local_60 = *(long *)(local_50 + 8) + (long)(in_ESI << 4) * 4;
  local_7c[0] = '\0';
  local_7c[1] = '\0';
  local_7c[2] = '\0';
  local_7c[3] = '\0';
  local_68 = *(long *)(local_58 + 0x10) + (long)((in_EDX * *(int *)(local_58 + 0x28) + in_ECX) * 4);
  local_70 = in_stack_00000008[3] + (long)in_ECX;
  local_78 = in_stack_00000008[4] + (long)in_EDX;
  uVar6 = (uint)in_stack_ffffffffffffff7c;
  blk_idx = in_EDX * (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                           [local_11] + in_ECX;
  local_12 = in_R9B;
  local_10 = in_ECX;
  local_c = in_EDX;
  local_8 = in_ESI;
  local_4 = in_EDI;
  iVar2 = is_blk_skip((uint8_t *)(local_38 + 0x24e09),in_EDI,blk_idx);
  if ((iVar2 == 0) && ((*(ushort *)(local_48 + 0xa7) >> 6 & 1) == 0)) {
    TVar1 = av1_get_tx_type((MACROBLOCKD *)
                            CONCAT17(in_stack_ffffffffffffff2f,
                                     CONCAT16(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28)),
                            in_stack_ffffffffffffff27,
                            CONCAT13((char)uVar5,CONCAT12(tx_size_00,uVar4)),in_EDX,
                            (TX_SIZE)((uint)in_ECX >> 0x18),
                            CONCAT13(plane_bsize_00,CONCAT12(tx_type_00,uVar3)));
    uVar7 = CONCAT13(TVar1,(int3)uVar6);
    in_stack_ffffffffffffff34 =
         is_trellis_used(*(TRELLIS_OPT_TYPE *)((long)local_20 + 0x29),in_stack_00000010);
    in_stack_ffffffffffffff30 = (uint)(in_stack_ffffffffffffff34 == 0);
    av1_setup_xform((AV1_COMMON *)
                    CONCAT17(in_stack_ffffffffffffff27,CONCAT43(uVar5,CONCAT12(tx_size_00,uVar4))),
                    (MACROBLOCK *)CONCAT44(in_EDX,in_ECX),plane_bsize_00,tx_type_00,
                    (TxfmParam *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    av1_setup_quant((TX_SIZE)((ulong)in_stack_ffffffffffffff00 >> 0x38),
                    (int)in_stack_ffffffffffffff00,(int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                    (int)in_stack_fffffffffffffef8,(QUANT_PARAM *)0x20adcc);
    av1_setup_qmatrix((CommonQuantParams *)
                      CONCAT17(plane_bsize_00,
                               CONCAT16(tx_type_00,CONCAT24(uVar3,in_stack_ffffffffffffff10))),
                      (MACROBLOCKD *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                      (int)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                      (TX_SIZE)((ulong)in_stack_ffffffffffffff00 >> 0x18),
                      (TX_TYPE)((ulong)in_stack_ffffffffffffff00 >> 0x10),in_stack_fffffffffffffef8)
    ;
    txb_ctx_00 = local_a0;
    in_stack_ffffffffffffff00 = local_c8;
    av1_xform_quant((MACROBLOCK *)
                    CONCAT17(plane_bsize_00,
                             CONCAT16(tx_type_00,CONCAT24(uVar3,in_stack_ffffffffffffff10))),
                    in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08,
                    (int)((ulong)in_stack_ffffffffffffff00 >> 0x20),(int)in_stack_ffffffffffffff00,
                    (BLOCK_SIZE)((ulong)txb_ctx_00 >> 0x38),
                    (TxfmParam *)
                    CONCAT17(in_stack_ffffffffffffff27,CONCAT43(uVar5,CONCAT12(tx_size_00,uVar4))),
                    (QUANT_PARAM *)
                    CONCAT17(in_stack_ffffffffffffff2f,
                             CONCAT16(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28)));
    in_stack_ffffffffffffff2f = 1;
    in_stack_ffffffffffffff2e = 1;
    if (in_stack_ffffffffffffff54 != 0) {
      get_txb_ctx(plane_bsize_00,tx_type_00,in_stack_ffffffffffffff10,
                  (ENTROPY_CONTEXT *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                  in_stack_ffffffffffffff00,txb_ctx_00);
      in_stack_ffffffffffffff00 = local_7c;
      av1_optimize_b(in_stack_ffffffffffffff58,
                     (MACROBLOCK *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48,in_stack_ffffffffffffff47,
                     in_stack_ffffffffffffff46,in_stack_ffffffffffffff70,
                     (int *)CONCAT44(uVar7,blk_idx));
    }
    if (in_stack_ffffffffffffff54 == 0) {
      av1_dropout_qcoeff((MACROBLOCK *)(ulong)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                         in_stack_ffffffffffffff48,in_stack_ffffffffffffff47,
                         in_stack_ffffffffffffff46,in_stack_ffffffffffffff40);
    }
  }
  else {
    *(undefined2 *)(*(long *)(local_50 + 0x20) + (long)local_8 * 2) = 0;
    *(undefined1 *)(*(long *)(local_50 + 0x28) + (long)local_8) = 0;
  }
  av1_set_txb_context((MACROBLOCK *)
                      CONCAT17(in_stack_ffffffffffffff27,CONCAT43(uVar5,CONCAT12(tx_size_00,uVar4)))
                      ,in_EDX,in_ECX,plane_bsize_00,
                      (ENTROPY_CONTEXT *)
                      CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                      in_stack_ffffffffffffff00);
  if (*(short *)(*(long *)(local_50 + 0x20) + (long)local_8 * 2) == 0) {
    *(byte *)(local_48 + 0x90) = *(byte *)(local_48 + 0x90) & 1;
  }
  else {
    *(undefined1 *)(local_48 + 0x90) = 0;
    av1_inverse_transform_block
              ((MACROBLOCKD *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               (tran_low_t *)
               CONCAT17(in_stack_ffffffffffffff2f,
                        CONCAT16(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28)),
               CONCAT13(in_stack_ffffffffffffff27,(int3)((uint)uVar5 >> 8)),(TX_TYPE)uVar5,
               tx_size_00,(uint8_t *)CONCAT44(in_EDX,in_ECX),in_stack_ffffffffffffff40,
               in_stack_ffffffffffffff48,in_stack_ffffffffffffff50);
  }
  if ((*(short *)(*(long *)(local_50 + 0x20) + (long)local_8 * 2) == 0) && (local_4 == 0)) {
    update_txk_array(local_40,local_c,local_10,local_12,'\0');
  }
  return;
}

Assistant:

static void encode_block(int plane, int block, int blk_row, int blk_col,
                         BLOCK_SIZE plane_bsize, TX_SIZE tx_size, void *arg,
                         RUN_TYPE dry_run) {
  (void)dry_run;
  struct encode_b_args *const args = arg;
  const AV1_COMP *const cpi = args->cpi;
  const AV1_COMMON *const cm = &cpi->common;
  MACROBLOCK *const x = args->x;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *mbmi = xd->mi[0];
  struct macroblock_plane *const p = &x->plane[plane];
  struct macroblockd_plane *const pd = &xd->plane[plane];
  tran_low_t *const dqcoeff = p->dqcoeff + BLOCK_OFFSET(block);
  uint8_t *dst;
  ENTROPY_CONTEXT *a, *l;
  int dummy_rate_cost = 0;

  const int bw = mi_size_wide[plane_bsize];
  dst = &pd->dst.buf[(blk_row * pd->dst.stride + blk_col) << MI_SIZE_LOG2];

  a = &args->ta[blk_col];
  l = &args->tl[blk_row];

  TX_TYPE tx_type = DCT_DCT;
  const int blk_skip_idx = blk_row * bw + blk_col;
  if (!is_blk_skip(x->txfm_search_info.blk_skip, plane, blk_skip_idx) &&
      !mbmi->skip_mode) {
    tx_type = av1_get_tx_type(xd, pd->plane_type, blk_row, blk_col, tx_size,
                              cm->features.reduced_tx_set_used);
    TxfmParam txfm_param;
    QUANT_PARAM quant_param;
    const int use_trellis = is_trellis_used(args->enable_optimize_b, dry_run);
    int quant_idx;
    if (use_trellis)
      quant_idx = AV1_XFORM_QUANT_FP;
    else
      quant_idx =
          USE_B_QUANT_NO_TRELLIS ? AV1_XFORM_QUANT_B : AV1_XFORM_QUANT_FP;
    av1_setup_xform(cm, x, tx_size, tx_type, &txfm_param);
    av1_setup_quant(tx_size, use_trellis, quant_idx,
                    cpi->oxcf.q_cfg.quant_b_adapt, &quant_param);
    av1_setup_qmatrix(&cm->quant_params, xd, plane, tx_size, tx_type,
                      &quant_param);
    av1_xform_quant(x, plane, block, blk_row, blk_col, plane_bsize, &txfm_param,
                    &quant_param);

    // Whether trellis or dropout optimization is required for inter frames.
    const bool do_trellis = INTER_BLOCK_OPT_TYPE == TRELLIS_OPT ||
                            INTER_BLOCK_OPT_TYPE == TRELLIS_DROPOUT_OPT;
    const bool do_dropout = INTER_BLOCK_OPT_TYPE == DROPOUT_OPT ||
                            INTER_BLOCK_OPT_TYPE == TRELLIS_DROPOUT_OPT;

    if (quant_param.use_optimize_b && do_trellis) {
      TXB_CTX txb_ctx;
      get_txb_ctx(plane_bsize, tx_size, plane, a, l, &txb_ctx);
      av1_optimize_b(args->cpi, x, plane, block, tx_size, tx_type, &txb_ctx,
                     &dummy_rate_cost);
    }
    if (!quant_param.use_optimize_b && do_dropout) {
      av1_dropout_qcoeff(x, plane, block, tx_size, tx_type,
                         cm->quant_params.base_qindex);
    }
  } else {
    p->eobs[block] = 0;
    p->txb_entropy_ctx[block] = 0;
  }

  av1_set_txb_context(x, plane, block, tx_size, a, l);

  if (p->eobs[block]) {
    // As long as any YUV plane has non-zero quantized transform coefficients,
    // mbmi->skip_txfm flag is set to 0.
    mbmi->skip_txfm = 0;
    av1_inverse_transform_block(xd, dqcoeff, plane, tx_type, tx_size, dst,
                                pd->dst.stride, p->eobs[block],
                                cm->features.reduced_tx_set_used);
  } else {
    // Only when YUV planes all have zero quantized transform coefficients,
    // mbmi->skip_txfm flag is set to 1.
    mbmi->skip_txfm &= 1;
  }

  // TODO(debargha, jingning): Temporarily disable txk_type check for eob=0
  // case. It is possible that certain collision in hash index would cause
  // the assertion failure. To further optimize the rate-distortion
  // performance, we need to re-visit this part and enable this assert
  // again.
  if (p->eobs[block] == 0 && plane == 0) {
#if 0
    if (args->cpi->oxcf.q_cfg.aq_mode == NO_AQ &&
        args->cpi->oxcf.q_cfg.deltaq_mode == NO_DELTA_Q) {
      // TODO(jingning,angiebird,huisu@google.com): enable txk_check when
      // enable_optimize_b is true to detect potential RD bug.
      const uint8_t disable_txk_check = args->enable_optimize_b;
      if (!disable_txk_check) {
        assert(xd->tx_type_map[blk_row * xd->tx_type_map_stride + blk_col)] ==
            DCT_DCT);
      }
    }
#endif
    update_txk_array(xd, blk_row, blk_col, tx_size, DCT_DCT);
  }

#if CONFIG_MISMATCH_DEBUG
  if (dry_run == OUTPUT_ENABLED) {
    int pixel_c, pixel_r;
    BLOCK_SIZE bsize = txsize_to_bsize[tx_size];
    int blk_w = block_size_wide[bsize];
    int blk_h = block_size_high[bsize];
    mi_to_pixel_loc(&pixel_c, &pixel_r, xd->mi_col, xd->mi_row, blk_col,
                    blk_row, pd->subsampling_x, pd->subsampling_y);
    mismatch_record_block_tx(dst, pd->dst.stride, cm->current_frame.order_hint,
                             plane, pixel_c, pixel_r, blk_w, blk_h,
                             xd->cur_buf->flags & YV12_FLAG_HIGHBITDEPTH);
  }
#endif
}